

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

_Bool ftp_213_date(char *p,int *year,int *month,int *day,int *hour,int *minute,int *second)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t len;
  int *minute_local;
  int *hour_local;
  int *day_local;
  int *month_local;
  int *year_local;
  char *p_local;
  
  sVar3 = strlen(p);
  if (sVar3 < 0xe) {
    p_local._7_1_ = false;
  }
  else {
    iVar1 = twodigit(p);
    iVar2 = twodigit(p + 2);
    *year = iVar1 * 100 + iVar2;
    iVar1 = twodigit(p + 4);
    *month = iVar1;
    iVar1 = twodigit(p + 6);
    *day = iVar1;
    iVar1 = twodigit(p + 8);
    *hour = iVar1;
    iVar1 = twodigit(p + 10);
    *minute = iVar1;
    iVar1 = twodigit(p + 0xc);
    *second = iVar1;
    if ((((*month < 0xd) && (*day < 0x20)) && (*hour < 0x18)) &&
       ((*minute < 0x3c && (*second < 0x3d)))) {
      p_local._7_1_ = true;
    }
    else {
      p_local._7_1_ = false;
    }
  }
  return p_local._7_1_;
}

Assistant:

static bool ftp_213_date(const char *p, int *year, int *month, int *day,
                         int *hour, int *minute, int *second)
{
  size_t len = strlen(p);
  if(len < 14)
    return FALSE;
  *year = twodigit(&p[0]) * 100 + twodigit(&p[2]);
  *month = twodigit(&p[4]);
  *day = twodigit(&p[6]);
  *hour = twodigit(&p[8]);
  *minute = twodigit(&p[10]);
  *second = twodigit(&p[12]);

  if((*month > 12) || (*day > 31) || (*hour > 23) || (*minute > 59) ||
     (*second > 60))
    return FALSE;
  return TRUE;
}